

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

double nk_strtod(char *str,char **endptr)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1958,"double nk_strtod(const char *, const char **)");
  }
  for (; *str == ' '; str = str + 1) {
  }
  if (*str == '-') {
    str = str + 1;
    dVar7 = -1.0;
  }
  else {
    dVar7 = 1.0;
  }
  dVar8 = 0.0;
  while( true ) {
    cVar2 = *str;
    if ((cVar2 == '\0') || (cVar2 == 'e')) goto LAB_001057c5;
    if (cVar2 == '.') break;
    dVar8 = dVar8 * 10.0 + (double)(cVar2 + -0x30);
    str = str + 1;
  }
  dVar9 = 0.1;
  while( true ) {
    str = str + 1;
    cVar2 = *str;
    if ((cVar2 == '\0') || (cVar2 == 'e')) break;
    dVar8 = dVar8 + (double)(cVar2 + -0x30) * dVar9;
    dVar9 = dVar9 * 0.1;
  }
LAB_001057c5:
  if (cVar2 == 'e') {
    bVar6 = (str[1] - 0x2bU & 0xfd) == 0;
    pcVar1 = str + 1;
    if (bVar6) {
      pcVar1 = str + 2;
    }
    cVar2 = str[(ulong)bVar6 + 1];
    dVar9 = 1.0;
    if (cVar2 != '\0') {
      iVar5 = 0;
      do {
        iVar4 = iVar5;
        iVar3 = (int)cVar2;
        iVar5 = iVar3 + iVar4 * 10 + -0x30;
        cVar2 = pcVar1[1];
        pcVar1 = pcVar1 + 1;
      } while (cVar2 != '\0');
      if (0 < iVar5) {
        iVar5 = iVar3 + iVar4 * 10 + -0x30;
        dVar9 = 1.0;
        do {
          dVar9 = dVar9 * 10.0;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
    if (str[1] == '-') {
      dVar8 = dVar8 / dVar9;
      str = pcVar1;
    }
    else {
      dVar8 = dVar8 * dVar9;
      str = pcVar1;
    }
  }
  if (endptr != (char **)0x0) {
    *endptr = str;
  }
  return dVar7 * dVar8;
}

Assistant:

NK_API double
nk_strtod(const char *str, const char **endptr)
{
    double m;
    double neg = 1.0;
    const char *p = str;
    double value = 0;
    double number = 0;

    NK_ASSERT(str);
    if (!str) return 0;

    /* skip whitespace */
    while (*p == ' ') p++;
    if (*p == '-') {
        neg = -1.0;
        p++;
    }

    while (*p && *p != '.' && *p != 'e') {
        value = value * 10.0 + (double) (*p - '0');
        p++;
    }

    if (*p == '.') {
        p++;
        for(m = 0.1; *p && *p != 'e'; p++ ) {
            value = value + (double) (*p - '0') * m;
            m *= 0.1;
        }
    }
    if (*p == 'e') {
        int i, pow, div;
        p++;
        if (*p == '-') {
            div = nk_true;
            p++;
        } else if (*p == '+') {
            div = nk_false;
            p++;
        } else div = nk_false;

        for (pow = 0; *p; p++)
            pow = pow * 10 + (int) (*p - '0');

        for (m = 1.0, i = 0; i < pow; i++)
            m *= 10.0;

        if (div)
            value /= m;
        else value *= m;
    }
    number = value * neg;
    if (endptr)
        *endptr = p;
    return number;
}